

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clientversion.cpp
# Opt level: O2

string * FormatSubVersion(string *__return_storage_ptr__,string *name,int nClientVersion,
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *comments)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  long in_FS_OFFSET;
  int local_90;
  int local_8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string comments_str;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  comments_str._M_dataplus._M_p = (pointer)&comments_str.field_2;
  comments_str._M_string_length = 0;
  comments_str.field_2._M_local_buf[0] = '\0';
  if ((comments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (comments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    util::
    Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
              (&local_88,(util *)comments,"; ");
    tinyformat::format<std::__cxx11::string>
              (&local_68,(tinyformat *)0x183a36,(char *)&local_88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)comments);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&comments_str,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
  }
  local_88._M_dataplus._M_p._0_4_ = nClientVersion / 10000;
  args_2 = &local_88;
  local_90 = nClientVersion % 100;
  local_8c = (int)((long)((ulong)(uint)((int)((long)nClientVersion / 100) >> 0x1f) << 0x20 |
                         (long)nClientVersion / 100 & 0xffffffffU) % 100);
  tinyformat::format<int,int,int>
            (&local_68,(tinyformat *)"%d.%d.%d",(char *)args_2,&local_8c,&local_90,(int *)args_2);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,(tinyformat *)"/%s:%s%s/",(char *)name,&local_68,&comments_str,
             args_2);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&comments_str);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string FormatSubVersion(const std::string& name, int nClientVersion, const std::vector<std::string>& comments)
{
    std::string comments_str;
    if (!comments.empty()) comments_str = strprintf("(%s)", Join(comments, "; "));
    return strprintf("/%s:%s%s/", name, FormatVersion(nClientVersion), comments_str);
}